

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O2

UInt32 crnlib::Bt4_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  CLzRef CVar1;
  CLzRef CVar2;
  byte *cur;
  CLzRef *pCVar3;
  bool bVar4;
  uint uVar5;
  UInt32 UVar6;
  UInt32 *pUVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  UInt32 UVar11;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 4) {
    MatchFinder_MovePos(p);
    return 0;
  }
  cur = p->buffer;
  uVar5 = (uint)cur[1] ^ p->crc[*cur];
  uVar8 = (uint)cur[2] << 8 ^ uVar5;
  uVar5 = uVar5 & 0x3ff;
  uVar10 = (ulong)(uVar8 & 0xffff);
  UVar11 = p->pos;
  pCVar3 = p->hash;
  CVar1 = pCVar3[uVar5];
  uVar9 = UVar11 - CVar1;
  CVar2 = pCVar3[uVar10 + 0x400];
  uVar8 = ((p->crc[cur[3]] << 5 ^ uVar8) & p->hashMask) + 0x10400;
  UVar6 = pCVar3[uVar8];
  pCVar3[uVar8] = UVar11;
  pCVar3[uVar10 + 0x400] = UVar11;
  pCVar3[uVar5] = UVar11;
  uVar5 = 1;
  uVar10 = 0;
  bVar4 = true;
  if ((uVar9 < p->cyclicBufferSize) && (cur[-(ulong)uVar9] == *cur)) {
    *distances = 2;
    distances[1] = uVar9 - 1;
    uVar10 = 2;
    bVar4 = false;
    uVar5 = 2;
  }
  if (((CVar2 == CVar1) || (uVar8 = UVar11 - CVar2, p->cyclicBufferSize <= uVar8)) ||
     (cur[-(ulong)uVar8] != *cur)) {
    if (bVar4) {
      uVar10 = 0;
LAB_00183d20:
      UVar11 = 3;
      if (3 < uVar5) {
        UVar11 = uVar5;
      }
      pUVar7 = GetMatchesSpec1(lenLimit,UVar6,p->pos,cur,p->son,p->cyclicBufferPos,
                               p->cyclicBufferSize,p->cutValue,distances + uVar10,UVar11);
      UVar11 = (UInt32)((ulong)((long)pUVar7 - (long)distances) >> 2);
      goto LAB_00183d5b;
    }
  }
  else {
    uVar5 = 3;
    distances[uVar10 + 1] = uVar8 - 1;
    uVar10 = (ulong)((int)uVar10 + 2);
    uVar9 = uVar8;
  }
  UVar11 = (UInt32)uVar10;
  for (; lenLimit != uVar5; uVar5 = uVar5 + 1) {
    if (cur[(ulong)uVar5 - (ulong)uVar9] != cur[uVar5]) {
      distances[UVar11 - 2] = uVar5;
      goto LAB_00183d20;
    }
  }
  distances[UVar11 - 2] = lenLimit;
  SkipMatchesSpec(lenLimit,UVar6,p->pos,cur,p->son,p->cyclicBufferPos,p->cyclicBufferSize,
                  p->cutValue);
LAB_00183d5b:
  p->cyclicBufferPos = p->cyclicBufferPos + 1;
  p->buffer = p->buffer + 1;
  UVar6 = p->pos + 1;
  p->pos = UVar6;
  if (UVar6 == p->posLimit) {
    MatchFinder_CheckLimits(p);
  }
  return UVar11;
}

Assistant:

static UInt32 Bt4_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 hash2Value, hash3Value, delta2, delta3, maxLen, offset;
  GET_MATCHES_HEADER(4)

  HASH4_CALC;

  delta2 = p->pos - p->hash[hash2Value];
  delta3 = p->pos - p->hash[kFix3HashSize + hash3Value];
  curMatch = p->hash[kFix4HashSize + hashValue];

  p->hash[hash2Value] =
      p->hash[kFix3HashSize + hash3Value] =
          p->hash[kFix4HashSize + hashValue] = p->pos;

  maxLen = 1;
  offset = 0;
  if (delta2 < p->cyclicBufferSize && *(cur - delta2) == *cur) {
    distances[0] = maxLen = 2;
    distances[1] = delta2 - 1;
    offset = 2;
  }
  if (delta2 != delta3 && delta3 < p->cyclicBufferSize && *(cur - delta3) == *cur) {
    maxLen = 3;
    distances[offset + 1] = delta3 - 1;
    offset += 2;
    delta2 = delta3;
  }
  if (offset != 0) {
    for (; maxLen != lenLimit; maxLen++)
      if (cur[(ptrdiff_t)maxLen - delta2] != cur[maxLen])
        break;
    distances[offset - 2] = maxLen;
    if (maxLen == lenLimit) {
      SkipMatchesSpec(lenLimit, curMatch, MF_PARAMS(p));
      MOVE_POS_RET;
    }
  }
  if (maxLen < 3)
    maxLen = 3;
  GET_MATCHES_FOOTER(offset, maxLen)
}